

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

bool is_affected(CHAR_DATA *ch,int sn)

{
  bool bVar1;
  AFFECT_DATA *pAVar2;
  
  if (ch == (CHAR_DATA *)0x0) {
    return false;
  }
  pAVar2 = (AFFECT_DATA *)&ch->affected;
  do {
    pAVar2 = pAVar2->next;
    bVar1 = pAVar2 != (AFFECT_DATA *)0x0;
    if (pAVar2 == (AFFECT_DATA *)0x0) {
      return bVar1;
    }
  } while (pAVar2->type != sn);
  return bVar1;
}

Assistant:

bool is_affected(CHAR_DATA *ch, int sn)
{
	AFFECT_DATA *paf;

	if (!ch)
		return false;

	for (paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->type == sn)
			return true;
	}

	return false;
}